

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_test.c
# Opt level: O3

void test_case_unsigned_add(zt_unit_test *test,void *data)

{
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  zt_unit_test_add_assertion(test);
  return;
}

Assistant:

static void
test_case_unsigned_add(struct zt_unit_test *test, void *data UNUSED)
{
    /* UCHAR pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_add(UCHAR_MAX, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_add(1, UCHAR_MAX)); */
    /* UCHAR neg common */
    ZT_UNIT_ASSERT(test, zt_uchar_add(UCHAR_MIN, -1) == UCHAR_MAX);
    ZT_UNIT_ASSERT(test, zt_uchar_add(-1, UCHAR_MIN) == UCHAR_MAX);
    /* UCHAR limits */
    ZT_UNIT_ASSERT(test, zt_uchar_add(UCHAR_MIN, 1) == UCHAR_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_uchar_add(1, UCHAR_MIN) == UCHAR_MIN + 1);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_add(UCHAR_MAX, -1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uchar_add(-1, UCHAR_MAX)); */
    /* UCHAR middle */
    ZT_UNIT_ASSERT(test, zt_uchar_add(UCHAR_MAX / 2, 1) == UCHAR_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_uchar_add(1, UCHAR_MAX / 2) == UCHAR_MAX / 2 + 1);


    /* USHORT pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_add(USHORT_MAX, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_add(1, USHORT_MAX)); */
    /* USHORT neg common */
    ZT_UNIT_ASSERT(test, zt_ushort_add(USHORT_MIN, -1) == USHORT_MAX);
    ZT_UNIT_ASSERT(test, zt_ushort_add(-1, USHORT_MIN) == USHORT_MAX);
    /* USHORT limits */
    ZT_UNIT_ASSERT(test, zt_ushort_add(USHORT_MIN, 1) == USHORT_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_ushort_add(1, USHORT_MIN) == USHORT_MIN + 1);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_add(USHORT_MAX, -1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ushort_add(-1, USHORT_MAX)); */
    /* USHORT middle */
    ZT_UNIT_ASSERT(test, zt_ushort_add(USHORT_MAX / 2, 1) == USHORT_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_ushort_add(1, USHORT_MAX / 2) == USHORT_MAX / 2 + 1);


    /* UINT pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_add(UINT_MAX, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_add(1, UINT_MAX)); */
    /* UINT neg common */
    ZT_UNIT_ASSERT(test, zt_uint_add(UINT_MIN, -1) == UINT_MAX);
    ZT_UNIT_ASSERT(test, zt_uint_add(-1, UINT_MIN) == UINT_MAX);
    /* UINT limits */
    ZT_UNIT_ASSERT(test, zt_uint_add(UINT_MIN, 1) == UINT_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_uint_add(1, UINT_MIN) == UINT_MIN + 1);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_add(UINT_MAX, -1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_uint_add(-1, UINT_MAX)); */
    /* UINT middle */
    ZT_UNIT_ASSERT(test, zt_uint_add(UINT_MAX / 2, 1) == UINT_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_uint_add(1, UINT_MAX / 2) == UINT_MAX / 2 + 1);


# ifndef __x86_64__
    /* ULONG pos common */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_add(ULONG_MAX, 1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_add(1, ULONG_MAX)); */
    /* ULONG neg common */
    ZT_UNIT_ASSERT(test, zt_ulong_add(ULONG_MIN, -1) == ULONG_MAX);
    ZT_UNIT_ASSERT(test, zt_ulong_add(-1, ULONG_MIN) == ULONG_MAX);
    /* ULONG limits */
    ZT_UNIT_ASSERT(test, zt_ulong_add(ULONG_MIN, 1) == ULONG_MIN + 1);
    ZT_UNIT_ASSERT(test, zt_ulong_add(1, ULONG_MIN) == ULONG_MIN + 1);
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_add(ULONG_MAX, -1)); */
    /* ZT_UNIT_ASSERT_RAISES(test, zt_exception.math.overflow, zt_ulong_add(-1, ULONG_MAX)); */
    /* ULONG middle */
    ZT_UNIT_ASSERT(test, zt_ulong_add(ULONG_MAX / 2, 1) == ULONG_MAX / 2 + 1);
    ZT_UNIT_ASSERT(test, zt_ulong_add(1, ULONG_MAX / 2) == ULONG_MAX / 2 + 1);
# endif /* ifndef __x86_64__ */
}